

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

void mqtt_reinit(mqtt_client *client,mqtt_pal_socket_handle socketfd,uint8_t *sendbuf,
                size_t sendbufsz,uint8_t *recvbuf,size_t recvbufsz)

{
  size_t recvbufsz_local;
  uint8_t *recvbuf_local;
  size_t sendbufsz_local;
  uint8_t *sendbuf_local;
  mqtt_pal_socket_handle socketfd_local;
  mqtt_client *client_local;
  
  client->error = MQTT_ERROR_CONNECT_NOT_CALLED;
  client->socketfd = socketfd;
  mqtt_mq_init(&client->mq,sendbuf,sendbufsz);
  (client->recv_buffer).mem_start = recvbuf;
  (client->recv_buffer).mem_size = recvbufsz;
  (client->recv_buffer).curr = (client->recv_buffer).mem_start;
  (client->recv_buffer).curr_sz = (client->recv_buffer).mem_size;
  return;
}

Assistant:

void mqtt_reinit(struct mqtt_client* client,
                 mqtt_pal_socket_handle socketfd,
                 uint8_t *sendbuf, size_t sendbufsz,
                 uint8_t *recvbuf, size_t recvbufsz)
{
    client->error = MQTT_ERROR_CONNECT_NOT_CALLED;
    client->socketfd = socketfd;

    mqtt_mq_init(&client->mq, sendbuf, sendbufsz);

    client->recv_buffer.mem_start = recvbuf;
    client->recv_buffer.mem_size = recvbufsz;
    client->recv_buffer.curr = client->recv_buffer.mem_start;
    client->recv_buffer.curr_sz = client->recv_buffer.mem_size;
}